

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_str_pad(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint uVar2;
  sxu32 sVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  jx9_value *pjVar7;
  char *zString;
  uint uVar8;
  int iVar9;
  bool bVar10;
  int iStrpad;
  int iLen;
  int local_50;
  int local_4c;
  char *local_48;
  uint local_3c;
  ulong local_38;
  
  if (nArg < 2) {
    pjVar7 = pCtx->pRet;
    pcVar6 = "";
    local_4c = 0;
LAB_001338b7:
    jx9_value_string(pjVar7,pcVar6,local_4c);
    return 0;
  }
  pcVar6 = jx9_value_to_string(*apArg,&local_4c);
  pjVar7 = apArg[1];
  jx9MemObjToInteger(pjVar7);
  iVar1 = *(int *)&pjVar7->x;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = local_4c;
  }
  uVar8 = iVar1 - iVar4;
  if (uVar8 == 0 || iVar1 < iVar4) {
    pjVar7 = pCtx->pRet;
    goto LAB_001338b7;
  }
  local_50 = 1;
  local_48 = pcVar6;
  if (nArg == 2) {
    pcVar6 = " ";
  }
  else {
    pcVar6 = jx9_value_to_string(apArg[2],&local_50);
    if (local_50 < 1) {
      local_50 = 1;
      pcVar6 = " ";
    }
    if (3 < nArg) {
      pjVar7 = apArg[3];
      jx9MemObjToInteger(pjVar7);
      uVar2 = *(uint *)&pjVar7->x;
      uVar5 = 1;
      if ((uVar2 & 0xfffffffd) == 0) {
        uVar5 = (ulong)uVar2;
      }
      goto LAB_0013392c;
    }
  }
  uVar5 = 1;
LAB_0013392c:
  iVar4 = local_50;
  zString = local_48;
  if ((uVar5 & 0xfffffffd) == 0) {
    bVar10 = (int)uVar5 == 2;
    local_3c = uVar8;
    local_38 = uVar5;
    if (0 < (int)(uVar8 >> bVar10)) {
      iVar9 = 0;
      do {
        if (iVar1 <= (int)((pCtx->pRet->sBlob).nByte + iVar4 + local_4c)) break;
        jx9_value_string(pCtx->pRet,pcVar6,iVar4);
        iVar9 = iVar9 + iVar4;
      } while (iVar9 < (int)(uVar8 >> bVar10));
    }
    uVar5 = local_38;
    uVar8 = local_3c;
    zString = local_48;
    if ((int)local_38 == 0) {
      while( true ) {
        iVar4 = local_4c + (pCtx->pRet->sBlob).nByte;
        if (iVar1 <= iVar4) break;
        iVar4 = iVar1 - iVar4;
        if (local_50 <= iVar4) {
          iVar4 = local_50;
        }
        if (iVar4 < 1) break;
        jx9_value_string(pCtx->pRet,pcVar6,iVar4);
      }
    }
  }
  if (0 < local_4c) {
    jx9_value_string(pCtx->pRet,zString,local_4c);
  }
  iVar4 = (int)uVar5;
  if (1 < iVar4 - 1U) {
    return 0;
  }
  if (0 < (int)(uVar8 >> (iVar4 == 2))) {
    iVar9 = 0;
    do {
      if (iVar1 <= (int)((pCtx->pRet->sBlob).nByte + local_50)) break;
      jx9_value_string(pCtx->pRet,pcVar6,local_50);
      iVar9 = iVar9 + local_50;
    } while (iVar9 < (int)(uVar8 >> (iVar4 == 2)));
  }
  while( true ) {
    sVar3 = (pCtx->pRet->sBlob).nByte;
    if (iVar1 <= (int)sVar3) {
      return 0;
    }
    iVar4 = iVar1 - sVar3;
    if (local_50 <= iVar4) {
      iVar4 = local_50;
    }
    if (iVar4 < 1) break;
    jx9_value_string(pCtx->pRet,pcVar6,iVar4);
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_pad(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen, iPadlen, iType, i, iDiv, iStrpad, iRealPad, jPad;
	const char *zIn, *zPad;
	if( nArg < 2 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	/* Padding length */
	iRealPad = iPadlen = jx9_value_to_int(apArg[1]);
	if( iPadlen > 0 ){
		iPadlen -= iLen;
	}
	if( iPadlen < 1  ){
		/* Return the string verbatim */
		jx9_result_string(pCtx, zIn, iLen);
		return JX9_OK;
	}
	zPad = " "; /* Whitespace padding */
	iStrpad = (int)sizeof(char);
	iType = 1 ; /* STR_PAD_RIGHT */
	if( nArg > 2 ){
		/* Padding string */
		zPad = jx9_value_to_string(apArg[2], &iStrpad);
		if( iStrpad < 1 ){
			/* Empty string */
			zPad = " "; /* Whitespace padding */
			iStrpad = (int)sizeof(char);
		}
		if( nArg > 3 ){
			/* Padd type */
			iType = jx9_value_to_int(apArg[3]);
			if( iType != 0 /* STR_PAD_LEFT */ && iType != 2 /* STR_PAD_BOTH */ ){
				iType = 1 ; /* STR_PAD_RIGHT */
			}
		}
	}
	iDiv = 1;
	if( iType == 2 ){
		iDiv = 2; /* STR_PAD_BOTH */
	}
	/* Perform the requested operation */
	if( iType == 0 /* STR_PAD_LEFT */ || iType == 2 /* STR_PAD_BOTH */ ){
		jPad = iStrpad;
		for( i = 0 ; i < iPadlen/iDiv ; i += jPad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iLen + jPad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
		if( iType == 0 /* STR_PAD_LEFT */ ){
			while( (int)jx9_context_result_buf_length(pCtx) + iLen < iRealPad ){
				jPad = iRealPad - (iLen + (int)jx9_context_result_buf_length(pCtx) );
				if( jPad > iStrpad ){
					jPad = iStrpad;
				}
				if( jPad < 1){
					break;
				}
				jx9_result_string(pCtx, zPad, jPad);
			}
		}
	}
	if( iLen > 0 ){
		/* Append the input string */
		jx9_result_string(pCtx, zIn, iLen);
	}
	if( iType == 1 /* STR_PAD_RIGHT */ || iType == 2 /* STR_PAD_BOTH */ ){
		for( i = 0 ; i < iPadlen/iDiv ; i += iStrpad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iStrpad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, iStrpad);
		}
		while( (int)jx9_context_result_buf_length(pCtx) < iRealPad ){
			jPad = iRealPad - (int)jx9_context_result_buf_length(pCtx);
			if( jPad > iStrpad ){
				jPad = iStrpad;
			}
			if( jPad < 1){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
	}
	return JX9_OK;
}